

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_AllRgbWidget.cpp
# Opt level: O2

void AllRgbWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined4 *puVar1;
  code *pcVar2;
  long lVar3;
  QImage *this;
  QImage aQStack_58 [24];
  QImage local_40 [24];
  QImage local_28 [24];
  
  this = aQStack_58;
  if (_c == IndexOfMethod) {
    puVar1 = (undefined4 *)*_a;
    pcVar2 = *_a[1];
    lVar3 = *(long *)((long)_a[1] + 8);
    if (pcVar2 == onTargetUpdated && lVar3 == 0) {
      *puVar1 = 0;
    }
    else if (pcVar2 == onAllRgbUpdated && lVar3 == 0) {
      *puVar1 = 1;
    }
    else if (pcVar2 == onIterationsChanged && lVar3 == 0) {
      *puVar1 = 2;
    }
    else if (pcVar2 == onImprovementsChanged && lVar3 == 0) {
      *puVar1 = 3;
    }
  }
  else if (_c == InvokeMetaMethod) {
    switch(_id) {
    case 0:
      QImage::QImage(local_28,(QImage *)_a[1]);
      onTargetUpdated((AllRgbWidget *)_o,local_28);
      this = local_28;
      break;
    case 1:
      QImage::QImage(local_40,(QImage *)_a[1]);
      onAllRgbUpdated((AllRgbWidget *)_o,local_40);
      this = local_40;
      break;
    case 2:
      onIterationsChanged((AllRgbWidget *)_o,*_a[1]);
      return;
    case 3:
      onImprovementsChanged((AllRgbWidget *)_o,*_a[1]);
      return;
    case 4:
      onResetPixelsRequested((AllRgbWidget *)_o);
      return;
    case 5:
      onLoadPixelsRequested((AllRgbWidget *)_o);
      return;
    case 6:
      onResetViewRequested((AllRgbWidget *)_o);
      return;
    case 7:
      onStartRequested((AllRgbWidget *)_o);
      return;
    case 8:
      onStopRequested((AllRgbWidget *)_o);
      return;
    case 9:
      onSaveImageRequested((AllRgbWidget *)_o);
      return;
    case 10:
      QImage::QImage(aQStack_58,(QImage *)_a[1]);
      onUpdateFromAlgorithm((AllRgbWidget *)_o,aQStack_58);
      break;
    default:
      goto switchD_0010a17a_default;
    }
    QImage::~QImage(this);
  }
switchD_0010a17a_default:
  return;
}

Assistant:

void AllRgbWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<AllRgbWidget *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->onTargetUpdated((*reinterpret_cast< std::add_pointer_t<QImage>>(_a[1]))); break;
        case 1: _t->onAllRgbUpdated((*reinterpret_cast< std::add_pointer_t<QImage>>(_a[1]))); break;
        case 2: _t->onIterationsChanged((*reinterpret_cast< std::add_pointer_t<quint64>>(_a[1]))); break;
        case 3: _t->onImprovementsChanged((*reinterpret_cast< std::add_pointer_t<quint64>>(_a[1]))); break;
        case 4: _t->onResetPixelsRequested(); break;
        case 5: _t->onLoadPixelsRequested(); break;
        case 6: _t->onResetViewRequested(); break;
        case 7: _t->onStartRequested(); break;
        case 8: _t->onStopRequested(); break;
        case 9: _t->onSaveImageRequested(); break;
        case 10: _t->onUpdateFromAlgorithm((*reinterpret_cast< std::add_pointer_t<QImage>>(_a[1]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (AllRgbWidget::*)(QImage );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&AllRgbWidget::onTargetUpdated)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (AllRgbWidget::*)(QImage );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&AllRgbWidget::onAllRgbUpdated)) {
                *result = 1;
                return;
            }
        }
        {
            using _t = void (AllRgbWidget::*)(quint64 );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&AllRgbWidget::onIterationsChanged)) {
                *result = 2;
                return;
            }
        }
        {
            using _t = void (AllRgbWidget::*)(quint64 );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&AllRgbWidget::onImprovementsChanged)) {
                *result = 3;
                return;
            }
        }
    }
}